

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O3

Greetable * object_peek_greetable(Object *object)

{
  undefined8 uVar1;
  long lVar2;
  GType GVar3;
  Greetable *pGVar4;
  
  uVar1 = g_dbus_object_get_type();
  uVar1 = g_type_check_instance_cast(object,uVar1);
  lVar2 = g_dbus_object_get_interface(uVar1,"io.mangoh.Testing.Greetable");
  if (lVar2 != 0) {
    g_object_unref(lVar2);
    GVar3 = greetable_get_type();
    pGVar4 = (Greetable *)g_type_check_instance_cast(lVar2,GVar3);
    return pGVar4;
  }
  return (Greetable *)0x0;
}

Assistant:

Greetable *object_peek_greetable (Object *object)
{
  GDBusInterface *ret;
  ret = g_dbus_object_get_interface (G_DBUS_OBJECT (object), "io.mangoh.Testing.Greetable");
  if (ret == NULL)
    return NULL;
  g_object_unref (ret);
  return GREETABLE (ret);
}